

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QList<QTableWidgetSelectionRange> * __thiscall
QTableWidget::selectedRanges
          (QList<QTableWidgetSelectionRange> *__return_storage_ptr__,QTableWidget *this)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QList<QTableWidgetSelectionRange> *result;
  QArrayDataPointer<QItemSelectionRange> local_68;
  QArrayDataPointer<QItemSelectionRange> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::selectionModel((QAbstractItemView *)this);
  QItemSelectionModel::selection();
  piVar1 = (int *)CONCAT44(local_68.d._4_4_,local_68.d._0_4_);
  local_50.size = local_68.size;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_68);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QTableWidgetSelectionRange *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QTableWidgetSelectionRange>::reserve(__return_storage_ptr__,(long)(int)local_68.size);
  uVar5 = 0;
  uVar6 = local_68.size & 0xffffffff;
  if ((int)local_68.size < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 * 0x10 != uVar5; uVar5 = uVar5 + 0x10) {
    uVar2 = QPersistentModelIndex::row();
    uVar3 = QPersistentModelIndex::column();
    uVar4 = QPersistentModelIndex::row();
    local_68.ptr._4_4_ = QPersistentModelIndex::column();
    local_68.d._0_4_ = uVar2;
    local_68.d._4_4_ = uVar3;
    local_68.ptr._0_4_ = uVar4;
    QList<QTableWidgetSelectionRange>::emplaceBack<QTableWidgetSelectionRange>
              (__return_storage_ptr__,(QTableWidgetSelectionRange *)&local_68);
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTableWidgetSelectionRange> QTableWidget::selectedRanges() const
{
    const QList<QItemSelectionRange> ranges = selectionModel()->selection();
    QList<QTableWidgetSelectionRange> result;
    const int rangesCount = ranges.size();
    result.reserve(rangesCount);
    for (int i = 0; i < rangesCount; ++i)
        result.append({ranges.at(i).top(),
                       ranges.at(i).left(),
                       ranges.at(i).bottom(),
                       ranges.at(i).right()});
    return result;
}